

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O1

bool __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::AnyEdgeIntersects
          (S2ShapeIndexRegion<S2ShapeIndex> *this,S2ClippedShape *clipped,S2Cell *target)

{
  char cVar1;
  S2ShapeIndex *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  R2Point p0;
  R2Point p1;
  Edge edge;
  R2Rect bound;
  R2Point local_a8;
  R2Point local_98;
  undefined1 local_88 [56];
  R2Rect local_50;
  
  if (AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError == '\0') {
    AnyEdgeIntersects();
  }
  local_88._0_8_ = (target->uv_).bounds_[0].bounds_.c_[0];
  local_88._8_8_ = (target->uv_).bounds_[0].bounds_.c_[1];
  local_88._16_8_ = (target->uv_).bounds_[1].bounds_.c_[0];
  local_88._24_8_ = (target->uv_).bounds_[1].bounds_.c_[1];
  local_a8.c_[0] = AnyEdgeIntersects::kMaxError;
  local_a8.c_[1] = AnyEdgeIntersects::kMaxError;
  R2Rect::Expanded(&local_50,(R2Rect *)local_88,&local_a8);
  cVar1 = target->face_;
  pSVar2 = (this->contains_query_).index_;
  iVar4 = (*pSVar2->_vptr_S2ShapeIndex[3])(pSVar2,(ulong)(uint)clipped->shape_id_);
  bVar9 = 1 < *(uint *)&clipped->field_0x4;
  if (bVar9) {
    uVar6 = (ulong)(*(uint *)&clipped->field_0x4 >> 1);
    uVar7 = 1;
    lVar8 = 0;
    do {
      paVar5 = &clipped->field_3;
      if (5 < *(uint *)&clipped->field_0x4) {
        paVar5 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(clipped->field_3).edges_;
      }
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18))
                ((S2Point *)local_88,(long *)CONCAT44(extraout_var,iVar4),
                 *(undefined4 *)((long)paVar5 + lVar8));
      local_a8.c_[0] = 0.0;
      local_a8.c_[1] = 0.0;
      local_98.c_[0] = 0.0;
      local_98.c_[1] = 0.0;
      bVar3 = S2::ClipToPaddedFace
                        ((S2Point *)local_88,(S2Point *)(local_88 + 0x18),(int)cVar1,
                         AnyEdgeIntersects::kMaxError,&local_a8,&local_98);
      if ((bVar3) && (bVar3 = S2::IntersectsRect(&local_a8,&local_98,&local_50), bVar3)) {
        return bVar9;
      }
      bVar9 = uVar7 < uVar6;
      lVar8 = lVar8 + 4;
      uVar7 = uVar7 + 1;
    } while (uVar6 * 4 != lVar8);
  }
  return bVar9;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::AnyEdgeIntersects(
    const S2ClippedShape& clipped, const S2Cell& target) const {
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  const R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  const int face = target.face();
  const S2Shape& shape = *index().shape(clipped.shape_id());
  const int num_edges = clipped.num_edges();
  for (int i = 0; i < num_edges; ++i) {
    const auto edge = shape.edge(clipped.edge(i));
    R2Point p0, p1;
    if (S2::ClipToPaddedFace(edge.v0, edge.v1, face, kMaxError, &p0, &p1) &&
        S2::IntersectsRect(p0, p1, bound)) {
      return true;
    }
  }
  return false;
}